

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool helics::checkTypeMatch(string_view type1,string_view type2,bool strict_match)

{
  bool bVar1;
  const_iterator cVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  string_view type2_local;
  string_view type1_local;
  
  type2_local._M_str = type2._M_str;
  type1_local._M_str = type1._M_str;
  type1_local._M_len = type1._M_len;
  if ((((type1_local._M_len != 0) &&
       (type2_local._M_len = type2._M_len,
       bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type1,
                               (basic_string_view<char,_std::char_traits<char>_>)type2), !bVar1)) &&
      (__y._M_str = "def", __y._M_len = 3,
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type1,__y), !bVar1))
     && ((__y_00._M_str = "any", __y_00._M_len = 3,
         bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type1,__y_00),
         !bVar1 && (__y_01._M_str = "raw", __y_01._M_len = 3,
                   bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type1,
                                           __y_01), !bVar1)))) {
    __y_02._M_str = "json";
    __y_02._M_len = 4;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type1,__y_02);
    if (strict_match || bVar1) {
      return bVar1;
    }
    if (((type2._M_len != 0) &&
        (__y_03._M_str = "def", __y_03._M_len = 3,
        bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type2,__y_03),
        !bVar1)) &&
       (__y_04._M_str = "any", __y_04._M_len = 3,
       bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type2,__y_04),
       !bVar1)) {
      __y_05._M_str = "json";
      __y_05._M_len = 4;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type1,__y_05);
      if (bVar1) {
        return true;
      }
      cVar2 = std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)convertible_set,(key_type *)&type1_local);
      if (cVar2._M_node != (_Base_ptr)(convertible_set + 8)) {
        cVar2 = std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)convertible_set,(key_type *)&type2_local);
        return cVar2._M_node != (_Base_ptr)(convertible_set + 8);
      }
      __y_06._M_str = "raw";
      __y_06._M_len = 3;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type2,__y_06);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool checkTypeMatch(std::string_view type1, std::string_view type2, bool strict_match)
{
    if ((type1.empty()) || (type1 == type2) || (type1 == "def") || (type1 == "any") ||
        (type1 == "raw") || (type1 == "json")) {
        return true;
    }
    if (strict_match) {
        return false;
    }

    if ((type2.empty()) || (type2 == "def") || (type2 == "any") || (type1 == "json")) {
        return true;
    }
    if (convertible_set.find(type1) != convertible_set.end()) {
        return ((convertible_set.find(type2) != convertible_set.end()));
    }
    return (type2 == "raw");
}